

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

void crnlib::rg_etc1::etc1_block::get_abs_subblock_colors
               (color_quad_u8 *pDst,uint16 packed_color4,uint table_idx)

{
  long lVar1;
  uint in_EDX;
  int y3;
  int y2;
  int y1;
  int y0;
  int ib;
  int ig;
  int ir;
  uint b;
  uint g;
  uint r;
  int *pInten_modifer_table;
  bool in_stack_ffffffffffffffbd;
  uint16 in_stack_ffffffffffffffbe;
  parameter_t in_stack_ffffffffffffffc0;
  parameter_t in_stack_ffffffffffffffc4;
  parameter_t blue;
  parameter_t in_stack_ffffffffffffffc8;
  parameter_t green;
  undefined4 in_stack_ffffffffffffffcc;
  parameter_t red;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_24;
  undefined4 local_20;
  
  lVar1 = (ulong)in_EDX * 0x10;
  unpack_color4((uint *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                (uint *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                (uint *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbd);
  red = *(parameter_t *)(g_etc1_inten_tables + lVar1);
  color_quad_u8::set((color_quad_u8 *)CONCAT44(local_20,local_24),red,in_stack_ffffffffffffffc8,
                     in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  green = *(parameter_t *)(g_etc1_inten_tables + lVar1 + 4);
  color_quad_u8::set((color_quad_u8 *)CONCAT44(local_20,local_24),red,green,
                     in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  blue = *(parameter_t *)(g_etc1_inten_tables + lVar1 + 8);
  color_quad_u8::set((color_quad_u8 *)CONCAT44(local_20,local_24),red,green,blue,
                     in_stack_ffffffffffffffc0);
  color_quad_u8::set((color_quad_u8 *)CONCAT44(local_20,local_24),red,green,blue,
                     *(parameter_t *)(g_etc1_inten_tables + lVar1 + 0xc));
  return;
}

Assistant:

void etc1_block::get_abs_subblock_colors(color_quad_u8* pDst, uint16 packed_color4, uint table_idx) {
  RG_ETC1_ASSERT(table_idx < cETC1IntenModifierValues);
  const int* pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

  uint r, g, b;
  unpack_color4(r, g, b, packed_color4, true);

  const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

  const int y0 = pInten_modifer_table[0];
  pDst[0].set(ir + y0, ig + y0, ib + y0);

  const int y1 = pInten_modifer_table[1];
  pDst[1].set(ir + y1, ig + y1, ib + y1);

  const int y2 = pInten_modifer_table[2];
  pDst[2].set(ir + y2, ig + y2, ib + y2);

  const int y3 = pInten_modifer_table[3];
  pDst[3].set(ir + y3, ig + y3, ib + y3);
}